

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O0

void __thiscall OpenMD::NPTf::loadEta(NPTf *this)

{
  SquareMatrix3<double> *in_RDI;
  Snapshot *in_stack_ffffffffffffff88;
  
  Snapshot::getBarostat(in_stack_ffffffffffffff88);
  SquareMatrix3<double>::operator=(in_RDI,(SquareMatrix3<double> *)in_stack_ffffffffffffff88);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2970ab);
  return;
}

Assistant:

void NPTf::loadEta() {
    eta = snap->getBarostat();

    // if (!eta.isDiagonal()) {
    //    snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
    //             "NPTf error: the diagonal elements of eta matrix are not the
    //             same or etaMat is not a diagonal matrix");
    //    painCave.isFatal = 1;
    //    simError();
    //}
  }